

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::EnumStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this_00;
  uint uVar2;
  SQInteger SVar3;
  long lVar4;
  SQObjectValue SVar5;
  SQObjectValue SVar6;
  SQObjectValue SVar7;
  SQObject SVar8;
  SQObject SVar9;
  SQObjectPtr strongid;
  SQObjectPtr local_88;
  SQObjectType local_74;
  SQObjectPtr local_70;
  SQLexer *local_60;
  SQObjectType local_54;
  SQObjectPtr local_50;
  SQObjectValue local_40;
  SQCompiler *local_38;
  
  local_60 = &this->_lex;
  SVar3 = SQLexer::Lex(local_60);
  this->_token = SVar3;
  SVar8 = Expect(this,0x102);
  local_40 = SVar8._unVal;
  local_54 = SVar8._type;
  Expect(this,0x7b);
  SVar8 = SQFuncState::CreateTable(this->_fs);
  SVar5 = SVar8._unVal;
  local_74 = SVar8._type;
  if (this->_token != 0x7d) {
    SVar6.pTable = (SQTable *)0x0;
    local_38 = this;
    do {
      SVar8 = Expect(this,0x102);
      if (this->_token == 0x3d) {
        SVar3 = SQLexer::Lex(local_60);
        this->_token = SVar3;
        SVar9 = ExpectScalar(this);
        SVar7 = SVar6;
      }
      else {
        SVar7.pTable = (SQTable *)
                       ((long)&((SVar6.pTable)->super_SQDelegable).super_SQCollectable.
                               super_SQRefCounted._vptr_SQRefCounted + 1);
        SVar9._unVal.pTable = SVar6.pTable;
        SVar9._0_8_ = 0x5000002;
      }
      local_70.super_SQObject._unVal = SVar9._unVal;
      if ((SVar8._type >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar8._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_70.super_SQObject._type = SVar9._type;
      if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_88.super_SQObject._type = SVar8._type;
      local_88.super_SQObject._unVal.nInteger = SVar8._unVal.nInteger;
      SQTable::NewSlot(SVar5.pTable,&local_88,&local_70);
      this = local_38;
      SQObjectPtr::~SQObjectPtr(&local_70);
      SQObjectPtr::~SQObjectPtr(&local_88);
      lVar4 = this->_token;
      if (lVar4 == 0x2c) {
        lVar4 = SQLexer::Lex(local_60);
        this->_token = lVar4;
      }
      SVar6 = SVar7;
    } while (lVar4 != 0x7d);
  }
  this_00 = (this->_vm->_sharedstate->_consts).super_SQObject._unVal.pTable;
  local_88.super_SQObject._type = local_54;
  local_88.super_SQObject._unVal.pTable = local_40.pTable;
  if ((local_54 >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar1 = &((local_40.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_70.super_SQObject._unVal.pTable = local_40.pTable;
  local_70.super_SQObject._type = local_54;
  local_50.super_SQObject._type = local_74;
  if ((local_74 >> 0x1b & 1) != 0) {
    pSVar1 = &((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_50.super_SQObject._unVal.nInteger = SVar5.nInteger;
  SQTable::NewSlot(this_00,&local_70,&local_50);
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_70);
  SVar5 = local_88.super_SQObject._unVal;
  uVar2 = local_88.super_SQObject._type >> 0x1b;
  local_88.super_SQObject._type = OT_NULL;
  local_88.super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((uVar2 & 1) != 0) {
    pSVar1 = &((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*((SVar5.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
        _vptr_SQRefCounted[2])();
    }
  }
  SVar3 = SQLexer::Lex(local_60);
  this->_token = SVar3;
  SQObjectPtr::~SQObjectPtr(&local_88);
  return;
}

Assistant:

void EnumStatement()
    {
        Lex();
        SQObject id = Expect(TK_IDENTIFIER);
        Expect(_SC('{'));

        SQObject table = _fs->CreateTable();
        SQInteger nval = 0;
        while(_token != _SC('}')) {
            SQObject key = Expect(TK_IDENTIFIER);
            SQObject val;
            if(_token == _SC('=')) {
                Lex();
                val = ExpectScalar();
            }
            else {
                val._type = OT_INTEGER;
                val._unVal.nInteger = nval++;
            }
            _table(table)->NewSlot(SQObjectPtr(key),SQObjectPtr(val));
            if(_token == ',') Lex();
        }
        SQTable *enums = _table(_ss(_vm)->_consts);
        SQObjectPtr strongid = id;
        enums->NewSlot(SQObjectPtr(strongid),SQObjectPtr(table));
        strongid.Null();
        Lex();
    }